

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall Nova::Driver<float,_3>::Write_Time(Driver<float,_3> *this,int frame)

{
  __cxx11 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [36];
  int local_14;
  Driver<float,_3> *pDStack_10;
  int frame_local;
  Driver<float,_3> *this_local;
  
  if ((this->example->write_time & 1U) != 0) {
    local_14 = frame;
    pDStack_10 = this;
    std::operator+(local_78,(char *)&this->example->output_directory);
    std::__cxx11::to_string(local_98,local_14);
    std::operator+(local_58,local_78);
    std::operator+(local_38,(char *)local_58);
    File_Utilities::Write_To_File<float>(local_38,&this->time);
    std::__cxx11::string::~string((string *)local_38);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void Driver<T,d>::
Write_Time(const int frame) const
{
    if(example.write_time) File_Utilities::Write_To_File<T>(example.output_directory+"/"+std::to_string(frame)+"/time",time);
}